

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,false>
               (int *begin,int *end,comm *param_3)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  iterator __first;
  unsigned_long __n;
  reference msgs;
  reference out;
  iterator iVar4;
  iterator iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1d8;
  allocator<int> local_1c9;
  undefined1 local_1c8 [8];
  vector<int,_std::allocator<int>_> recv_elements;
  size_t recv_n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  undefined1 local_150 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<int,_std::allocator<int>_> local_120;
  int *local_100;
  int *local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  long local_d8;
  size_t s;
  vector<int,_std::allocator<int>_> local_splitters;
  undefined1 local_a0 [7];
  bool _AssumeBlockDecomp;
  blk_dist mypart;
  size_t global_size;
  size_t local_50;
  size_t local_size;
  int *local_40;
  int *local_38;
  int local_2c;
  comm *pcStack_28;
  int p;
  comm *comm_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  pcStack_28 = param_3;
  local_18._M_current = end;
  end_local._M_current = begin;
  local_2c = mxx::comm::size(param_3);
  local_38 = end_local._M_current;
  local_40 = local_18._M_current;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (end_local._M_current,local_18._M_current);
  if (local_2c != 1) {
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (end_local,local_18);
    mypart.div1mod = allreduce<unsigned_long>(&local_50,pcStack_28);
    blk_dist_buf::blk_dist_buf((blk_dist_buf *)local_a0,mypart.div1mod,pcStack_28);
    sVar1 = local_50;
    sVar3 = blk_dist_buf::local_size((blk_dist_buf *)local_a0);
    bVar2 = all_of(sVar1 == sVar3,pcStack_28);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&s);
    local_d8 = (long)(local_2c + -1);
    if (bVar2) {
      local_f8 = end_local._M_current;
      local_100 = local_18._M_current;
      sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (&local_f0,(impl *)end_local._M_current,local_18._M_current,local_d8,pcStack_28);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&s,&local_f0);
      std::vector<int,_std::allocator<int>_>::~vector(&local_f0);
    }
    else {
      sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (&local_120,(impl *)end_local._M_current,local_18._M_current,local_d8,pcStack_28);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&s,&local_120);
      std::vector<int,_std::allocator<int>_>::~vector(&local_120);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
    split<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (&local_168,(impl *)end_local._M_current,local_18._M_current,&s,pcStack_28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,&local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_168);
    all2all<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,pcStack_28);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    recv_elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    __n = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )recv_elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
    if (((bVar2) && ((ulong)(long)local_2c < local_50)) && (local_50 * 2 < __n)) {
      assert_fail("!_AssumeBlockDecomp || (local_size <= (size_t)p || recv_n <= 2* local_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                  ,0x16b,"samplesort");
    }
    std::allocator<int>::allocator(&local_1c9);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1c8,__n,&local_1c9);
    std::allocator<int>::~allocator(&local_1c9);
    msgs = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&end_local);
    local_1d8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_1c8);
    out = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_1d8);
    all2allv<int>(msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,out,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n,pcStack_28);
    iVar4 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_1c8);
    iVar5 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_1c8);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (iVar4._M_current,iVar5._M_current);
    if (bVar2) {
      iVar4 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_1c8);
      iVar5 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_1c8);
      stable_distribute<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  iVar5._M_current,end_local,pcStack_28);
    }
    else {
      iVar4 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_1c8);
      iVar5 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_1c8);
      redo_arbit_decomposition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  iVar5._M_current,end_local,local_50,pcStack_28);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1c8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&s);
    blk_dist_buf::~blk_dist_buf((blk_dist_buf *)local_a0);
  }
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm) {
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    int p = comm.size();

    SS_TIMER_START(comm);

    // perform local (stable) sorting
    if (_Stable)
        std::stable_sort(begin, end, comp);
    else
        std::sort(begin, end, comp);

    // sequential case: we're done
    if (p == 1)
        return;

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_sort");


    // local size
    size_t local_size = std::distance(begin, end);

    // check if we have a perfect block decomposition
    size_t global_size = mxx::allreduce(local_size, comm);
    blk_dist mypart(global_size, comm);
    bool _AssumeBlockDecomp = mxx::all_of(local_size == mypart.local_size(), comm);

    // sample sort
    // 1. local sort
    // 2. pick `s` samples regularly spaced on each processor
    // 3. bitonic sort samples
    // 4. allgather the last sample of each process -> splitters
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears twice, then split evenly)
    //    => send_counts
    // 6. distribute send_counts with all2all to get recv_counts
    // 7. allocate enough space (may be more than previously allocated) for receiving
    // 8. all2allv
    // 9. local reordering (multiway-merge or again std::sort)
    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by sending elements to neighbors

    // get splitters, using the method depending on whether the input consists
    // of arbitrary decompositions or not
    std::vector<value_type> local_splitters;
    // number of samples
    size_t s = p-1;
    if(_AssumeBlockDecomp)
        local_splitters = sample_block_decomp(begin, end, comp, s, comm);
    else
        local_splitters = sample_arbit_decomp(begin, end, comp, s, comm);
    SS_TIMER_END_SECTION("get_splitters");

    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    std::vector<size_t> send_counts;
    if (_Stable)
        send_counts = stable_split(begin, end, comp, local_splitters, comm);
    else
        send_counts = split(begin, end, comp, local_splitters, comm);
    SS_TIMER_END_SECTION("send_counts");


    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    size_t recv_n = std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0));
    MXX_ASSERT(!_AssumeBlockDecomp || (local_size <= (size_t)p || recv_n <= 2* local_size));
    std::vector<value_type> recv_elements(recv_n);
    // TODO: use collective with iterators [begin,end) instead of pointers!
    mxx::all2allv(&(*begin), send_counts, &(*recv_elements.begin()), recv_counts, comm);
    SS_TIMER_END_SECTION("all2all");

    // 9. local reordering
    /* multiway-merge (using the implementation in __gnu_parallel) */
#ifdef MXX_USE_GCC_MULTIWAY_MERGE
    if (!_Stable && local_size > (size_t)p*p) {
        // prepare the sequence offsets
        typedef typename std::vector<value_type>::iterator val_it;
        std::vector<std::pair<val_it, val_it> > seqs(p);
        std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
        for (int i = 0; i < p; ++i) {
            seqs[i].first = recv_elements.begin() + recv_displs[i];
            seqs[i].second = seqs[i].first + recv_counts[i];
        }
        val_it start_merge_it = recv_elements.begin();

        size_t merge_n = local_size;
        value_type* merge_buf_begin = &(*begin);
        std::vector<value_type> merge_buf;
        // TODO: reasonable values for the buffer?
        // currently: at least 1/10 th of the size to merge or 1 MiB
        if (local_size == 0 || local_size < recv_n / 10)
        {
            // at least 1MB buffer
            merge_n = std::max<size_t>(recv_n / 10, (1024*1024)/sizeof(value_type));
            merge_buf.resize(merge_n);
            merge_buf_begin = &merge_buf[0];
        }
        for (; recv_n > 0;)
        {
            if (recv_n < merge_n)
                merge_n = recv_n;
            // i)   merge at most `local_size` many elements sequentially
            __gnu_parallel::sequential_tag seq_tag;
            __gnu_parallel::multiway_merge(seqs.begin(), seqs.end(), merge_buf_begin, merge_n, comp, seq_tag);

            // ii)  compact the remaining elements in `recv_elements`
            for (int i = p-1; i > 0; --i)
            {
                seqs[i-1].first = std::copy_backward(seqs[i-1].first, seqs[i-1].second, seqs[i].first);
                seqs[i-1].second = seqs[i].first;
            }
            // iii) copy the output buffer `local_size` elements back into
            //      `recv_elements`
            start_merge_it = std::copy(merge_buf_begin, merge_buf_begin + merge_n, start_merge_it);
            assert(start_merge_it == seqs[0].first);

            // reduce the number of elements to be merged
            recv_n -= merge_n;
        }
        // clean up
        merge_buf.clear(); merge_buf.shrink_to_fit();
    } else
#endif
    {
        if (_Stable)
            std::stable_sort(recv_elements.begin(), recv_elements.end(), comp);
        else
            std::sort(recv_elements.begin(), recv_elements.end(), comp);
    }

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_merge");

    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by elements to neighbors
    //    and save elements into the original iterator positions
    if (_AssumeBlockDecomp)
        stable_distribute(recv_elements.begin(), recv_elements.end(), begin, comm);
    else
        redo_arbit_decomposition(recv_elements.begin(), recv_elements.end(), begin, local_size, comm);

    SS_TIMER_END_SECTION("fix_partition");
}